

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void install_stars(void)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Wrapper *pAVar6;
  Am_Object *pAVar7;
  time_t tVar8;
  Am_Value *this;
  uint uVar9;
  Am_Style *pAVar10;
  int iVar11;
  float fVar12;
  Am_Style color;
  Am_Object star_proto;
  Am_Point_List star_pl;
  Am_Object local_70;
  float local_64;
  Am_Object local_60;
  float local_58;
  float local_54;
  Am_Object local_50;
  Am_Object local_48;
  Am_Point_List local_40 [16];
  
  Am_Point_List::Am_Point_List(local_40,install_stars::star_ar,0xc);
  Am_Object::Create((char *)&local_70);
  pAVar6 = Am_Point_List::operator_cast_to_Am_Wrapper_(local_40);
  pAVar7 = (Am_Object *)Am_Object::Set((ushort)&local_70,(Am_Wrapper *)0xb2,(ulong)pAVar6);
  Am_Object::Am_Object(&local_60,pAVar7);
  Am_Object::~Am_Object(&local_70);
  tVar8 = time((time_t *)0x0);
  srand((uint)tVar8);
  Am_Style::Am_Style((Am_Style *)&local_70);
  iVar11 = 0x3c;
  do {
    iVar3 = rand();
    local_64 = (float)iVar3 * 4.656613e-10;
    iVar3 = rand();
    local_64 = local_64 * 20.0;
    iVar4 = rand();
    local_54 = (float)scrollable_width_init;
    iVar5 = rand();
    local_58 = (float)scrollable_height_init;
    this = (Am_Value *)Am_Object::Get(0xf0a8,0x87);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    pAVar10 = (Am_Style *)&Am_White;
    if (bVar1) {
      fVar12 = (float)iVar3 * 4.656613e-10;
      pAVar10 = (Am_Style *)&Am_Yellow;
      if ((((0.15 <= fVar12) && (pAVar10 = (Am_Style *)&Am_Red, 0.3 <= fVar12)) &&
          (pAVar10 = (Am_Style *)&Am_Blue, 0.45 <= fVar12)) &&
         (pAVar10 = (Am_Style *)&Am_White, fVar12 < 0.6)) {
        pAVar10 = (Am_Style *)&Am_Purple;
      }
    }
    Am_Style::operator=((Am_Style *)&local_70,pAVar10);
    Am_Object::Create((char *)&local_50);
    pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&local_70);
    uVar2 = Am_Object::Set((ushort)&local_50,(Am_Wrapper *)0x6b,(ulong)pAVar6);
    uVar2 = Am_Object::Set(uVar2,100,(ulong)(uint)(int)((float)iVar4 * 4.656613e-10 * local_54));
    uVar2 = Am_Object::Set(uVar2,0x65,(ulong)(uint)(int)((float)iVar5 * 4.656613e-10 * local_58));
    uVar9 = (uint)local_64;
    uVar2 = Am_Object::Set(uVar2,0x66,(ulong)uVar9);
    pAVar7 = (Am_Object *)Am_Object::Set(uVar2,0x67,(ulong)uVar9);
    Am_Object::Am_Object(&local_48,pAVar7);
    Am_Object::Add_Part((Am_Object)0x10e3e0,SUB81(&local_48,0),1);
    Am_Object::~Am_Object(&local_48);
    Am_Object::~Am_Object(&local_50);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  Am_Style::~Am_Style((Am_Style *)&local_70);
  Am_Object::~Am_Object(&local_60);
  Am_Point_List::~Am_Point_List(local_40);
  return;
}

Assistant:

void
install_stars()
{

  static int star_ar[12] = {100, 0, 159, 181, 5, 69, 195, 69, 41, 181, 100, 0};
  Am_Point_List star_pl(star_ar, 12);
  int left, top, width, height;

  Am_Object star_proto =
      Am_Polygon.Create("SP_Star_Proto").Set(Am_POINT_LIST, star_pl);

  srand((unsigned)time(nullptr)); //init random generator
  Am_Style color;

  for (int i = 0; i < NUM_STARS; i++) {
    float size_r = ((float)rand()) / RAND_MAX;
    float color_r = ((float)rand()) / RAND_MAX;
    width = (int)(size_r * 20);
    height = (int)(size_r * 20);
    left = (int)((((float)rand()) / RAND_MAX) * scrollable_width_init);
    top = (int)((((float)rand()) / RAND_MAX) * scrollable_height_init);
    if (!(bool)Am_Screen.Get(Am_IS_COLOR))
      color = Am_White;
    else if (color_r < 0.15)
      color = Am_Yellow;
    else if (color_r < 0.3)
      color = Am_Red;
    else if (color_r < 0.45)
      color = Am_Blue;
    else if (color_r < 0.6)
      color = Am_Purple;
    else
      color = Am_White;

    SP_Star_Agg.Add_Part(star_proto.Create()
                             .Set(Am_LINE_STYLE, color)
                             .Set(Am_LEFT, left)
                             .Set(Am_TOP, top)
                             .Set(Am_WIDTH, width)
                             .Set(Am_HEIGHT, height));
  }
}